

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_18c49e::readWholeFiles(string *fn)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  __type _Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  float *pfVar10;
  Vec2<float> *this;
  Vec2<float> *v;
  int *piVar11;
  Channel *pCVar12;
  ostream *poVar13;
  void *this_00;
  ChannelList *this_01;
  ChannelList *pCVar14;
  size_type sVar15;
  reference pvVar16;
  reference __b;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int yLevel;
  int xLevel;
  int numYLevels;
  int numXLevels;
  TiledInputPart part_1;
  FrameBuffer frameBuffer_1;
  InputPart part;
  FrameBuffer frameBuffer;
  int partNumber;
  int i;
  int b;
  int a;
  int i_3;
  int i_2;
  int nHeaders;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Channel c2;
  Channel c1;
  ConstIterator i2;
  ConstIterator i1;
  Header *header;
  size_t i_1;
  MultiPartInputFile file;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  undefined4 in_stack_fffffffffffffc68;
  int iVar17;
  int height;
  int in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc71;
  undefined1 in_stack_fffffffffffffc72;
  undefined1 in_stack_fffffffffffffc73;
  int in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  ostream *in_stack_fffffffffffffd48;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffd50;
  Array2D<float> *in_stack_fffffffffffffd58;
  Array2D<unsigned_int> *in_stack_fffffffffffffd60;
  ostream *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  ostream *in_stack_fffffffffffffd80;
  int local_170;
  int local_16c;
  FrameBuffer local_160;
  FrameBuffer local_128;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  vector<int,_std::allocator<int>_> local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_80;
  ulong local_78;
  MultiPartInputFile local_70 [16];
  Array2D<Imath_3_2::half> local_60;
  Array2D<float> local_38;
  Array2D<unsigned_int> local_20;
  
  Imf_3_2::Array2D<unsigned_int>::Array2D(&local_20);
  Imf_3_2::Array2D<float>::Array2D(&local_38);
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&local_60);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_70,pcVar9,iVar6,true);
  local_78 = 0;
  while( true ) {
    uVar2 = local_78;
    iVar6 = Imf_3_2::MultiPartInputFile::parts();
    if ((ulong)(long)iVar6 <= uVar2) {
      poVar13 = std::operator<<((ostream *)&std::cout,"Reading whole files ");
      std::ostream::operator<<(poVar13,std::flush<char,std::char_traits<char>>);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1eba3f);
      sVar15 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::size
                         ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                          (anonymous_namespace)::headers);
      local_d4 = (int)sVar15;
      for (local_d8 = 0; local_d8 < local_d4; local_d8 = local_d8 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
      for (local_dc = 0; local_dc < local_d4; local_dc = local_dc + 1) {
        local_e0 = random_int(in_stack_fffffffffffffc74);
        local_e4 = random_int(in_stack_fffffffffffffc74);
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_e0);
        __b = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_e4);
        std::swap<int>(pvVar16,__b);
      }
      local_e8 = 0;
      do {
        if (local_d4 <= local_e8) {
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
          Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_70);
          Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)
                     CONCAT44(in_stack_fffffffffffffc74,
                              CONCAT13(in_stack_fffffffffffffc73,
                                       CONCAT12(in_stack_fffffffffffffc72,
                                                CONCAT11(in_stack_fffffffffffffc71,
                                                         in_stack_fffffffffffffc70)))));
          Imf_3_2::Array2D<float>::~Array2D
                    ((Array2D<float> *)
                     CONCAT44(in_stack_fffffffffffffc74,
                              CONCAT13(in_stack_fffffffffffffc73,
                                       CONCAT12(in_stack_fffffffffffffc72,
                                                CONCAT11(in_stack_fffffffffffffc71,
                                                         in_stack_fffffffffffffc70)))));
          Imf_3_2::Array2D<unsigned_int>::~Array2D
                    ((Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc74,
                              CONCAT13(in_stack_fffffffffffffc73,
                                       CONCAT12(in_stack_fffffffffffffc72,
                                                CONCAT11(in_stack_fffffffffffffc71,
                                                         in_stack_fffffffffffffc70)))));
          return;
        }
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_e8);
        local_ec = *pvVar16;
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                             (long)local_ec);
        if (*pvVar16 == 0) {
          Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1ebbc9);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_ec);
          iVar17 = 0x107;
          setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffd70,
                              (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                              in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                              in_stack_fffffffffffffd50,
                              (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                              (int)in_stack_fffffffffffffd80);
          Imf_3_2::InputPart::InputPart((InputPart *)&local_128,local_70,local_ec);
          Imf_3_2::InputPart::setFrameBuffer(&local_128);
          Imf_3_2::InputPart::readPixels((int)&local_128,0);
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::pixelTypes,(long)local_ec);
          iVar6 = *pvVar16;
          if (iVar6 == 0) {
            bVar3 = checkPixels<unsigned_int>
                              ((Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffc74,
                                        CONCAT13(in_stack_fffffffffffffc73,
                                                 CONCAT12(in_stack_fffffffffffffc72,
                                                          CONCAT11(in_stack_fffffffffffffc71,
                                                                   in_stack_fffffffffffffc70)))),
                               in_stack_fffffffffffffc6c,iVar17);
            if (!bVar3) {
              __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                            ,0x2e2,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
          }
          else if (iVar6 == 1) {
            bVar3 = checkPixels<float>((Array2D<float> *)
                                       CONCAT44(in_stack_fffffffffffffc74,
                                                CONCAT13(in_stack_fffffffffffffc73,
                                                         CONCAT12(in_stack_fffffffffffffc72,
                                                                  CONCAT11(in_stack_fffffffffffffc71
                                                                           ,
                                                  in_stack_fffffffffffffc70)))),
                                       in_stack_fffffffffffffc6c,iVar17);
            if (!bVar3) {
              __assert_fail("checkPixels<float> (fData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                            ,0x2e5,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
          }
          else if ((iVar6 == 2) &&
                  (bVar3 = checkPixels<Imath_3_2::half>
                                     ((Array2D<Imath_3_2::half> *)
                                      CONCAT44(in_stack_fffffffffffffc74,
                                               CONCAT13(in_stack_fffffffffffffc73,
                                                        CONCAT12(in_stack_fffffffffffffc72,
                                                                 CONCAT11(in_stack_fffffffffffffc71,
                                                                          in_stack_fffffffffffffc70)
                                                                ))),in_stack_fffffffffffffc6c,iVar17
                                     ), !bVar3)) {
            __assert_fail("checkPixels<half> (hData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                          ,0x2e8,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
          Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1ebdb2);
        }
        else {
          Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1ebdc4);
          Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&local_160,local_70,local_ec);
          iVar6 = Imf_3_2::TiledInputPart::numXLevels();
          iVar17 = Imf_3_2::TiledInputPart::numYLevels();
          for (local_16c = 0; local_16c < iVar6; local_16c = local_16c + 1) {
            for (local_170 = 0; local_170 < iVar17; local_170 = local_170 + 1) {
              bVar4 = Imf_3_2::TiledInputPart::isValidLevel((int)&local_160,local_16c);
              if ((bVar4 & 1) != 0) {
                in_stack_fffffffffffffc84 = Imf_3_2::TiledInputPart::levelWidth((int)&local_160);
                in_stack_fffffffffffffc80 = Imf_3_2::TiledInputPart::levelHeight((int)&local_160);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_ec);
                setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffd70,
                                    (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                                    in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                    in_stack_fffffffffffffd50,
                                    (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                                    (int)in_stack_fffffffffffffd80);
                Imf_3_2::TiledInputPart::setFrameBuffer(&local_160);
                iVar7 = Imf_3_2::TiledInputPart::numXTiles((int)&local_160);
                iVar8 = Imf_3_2::TiledInputPart::numYTiles((int)&local_160);
                height = local_170;
                Imf_3_2::TiledInputPart::readTiles
                          ((int)&local_160,0,iVar7 + -1,0,iVar8 + -1,local_16c);
                pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::pixelTypes,(long)local_ec);
                in_stack_fffffffffffffc74 = *pvVar16;
                if (in_stack_fffffffffffffc74 == 0) {
                  in_stack_fffffffffffffc73 =
                       checkPixels<unsigned_int>
                                 ((Array2D<unsigned_int> *)
                                  (ulong)CONCAT13(in_stack_fffffffffffffc73,
                                                  CONCAT12(in_stack_fffffffffffffc72,
                                                           CONCAT11(in_stack_fffffffffffffc71,
                                                                    in_stack_fffffffffffffc70))),
                                  in_stack_fffffffffffffc6c,height);
                  if (!(bool)in_stack_fffffffffffffc73) {
                    __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                  ,0x30c,
                                  "void (anonymous namespace)::readWholeFiles(const std::string &)")
                    ;
                  }
                }
                else if (in_stack_fffffffffffffc74 == 1) {
                  in_stack_fffffffffffffc72 =
                       checkPixels<float>((Array2D<float> *)
                                          CONCAT44(1,CONCAT13(in_stack_fffffffffffffc73,
                                                              CONCAT12(in_stack_fffffffffffffc72,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffc71,
                                                  in_stack_fffffffffffffc70)))),
                                          in_stack_fffffffffffffc6c,height);
                  if (!(bool)in_stack_fffffffffffffc72) {
                    __assert_fail("checkPixels<float> (fData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                  ,0x30f,
                                  "void (anonymous namespace)::readWholeFiles(const std::string &)")
                    ;
                  }
                }
                else if ((in_stack_fffffffffffffc74 == 2) &&
                        (in_stack_fffffffffffffc71 =
                              checkPixels<Imath_3_2::half>
                                        ((Array2D<Imath_3_2::half> *)
                                         CONCAT44(2,CONCAT13(in_stack_fffffffffffffc73,
                                                             CONCAT12(in_stack_fffffffffffffc72,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffc71,
                                                  in_stack_fffffffffffffc70)))),
                                         in_stack_fffffffffffffc6c,height),
                        !(bool)in_stack_fffffffffffffc71)) {
                  __assert_fail("checkPixels<half> (hData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x312,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
            }
          }
          Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1ec1be);
        }
        local_e8 = local_e8 + 1;
      } while( true );
    }
    local_80 = Imf_3_2::MultiPartInputFile::header((int)local_70);
    Imf_3_2::Header::displayWindow();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    Imf_3_2::Header::displayWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      ((Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    if (!bVar3) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_2::Header::dataWindow();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    Imf_3_2::Header::dataWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      ((Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    if (!bVar3) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    pfVar10 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar10;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    pfVar10 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar10) || (NAN(fVar1) || NAN(*pfVar10))) {
      __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x29a,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    this = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    v = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
    bVar3 = Imath_3_2::Vec2<float>::operator==(this,v);
    if (!bVar3) {
      __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    pfVar10 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar10;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    pfVar10 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar10) || (NAN(fVar1) || NAN(*pfVar10))) break;
    piVar11 = (int *)Imf_3_2::Header::lineOrder();
    iVar6 = *piVar11;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    piVar11 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar6 != *piVar11) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    piVar11 = (int *)Imf_3_2::Header::compression();
    iVar6 = *piVar11;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    piVar11 = (int *)Imf_3_2::Header::compression();
    if (iVar6 != *piVar11) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x29f,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_2::Header::channels();
    local_88 = Imf_3_2::ChannelList::begin();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    Imf_3_2::Header::channels();
    local_98 = Imf_3_2::ChannelList::begin();
    Imf_3_2::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)
               CONCAT44(in_stack_fffffffffffffc74,
                        CONCAT13(in_stack_fffffffffffffc73,
                                 CONCAT12(in_stack_fffffffffffffc72,
                                          CONCAT11(in_stack_fffffffffffffc71,
                                                   in_stack_fffffffffffffc70)))),
               (Iterator *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    pCVar12 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1eb606);
    local_a8 = *(undefined8 *)pCVar12;
    uStack_a0 = *(undefined8 *)(pCVar12 + 8);
    pCVar12 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1eb630);
    local_b8 = *(undefined8 *)pCVar12;
    uStack_b0 = *(undefined8 *)(pCVar12 + 8);
    bVar4 = Imf_3_2::Channel::operator==((Channel *)&local_a8,(Channel *)&local_b8);
    if ((bVar4 & 1) == 0) {
      poVar13 = std::operator<<((ostream *)&std::cout," type ");
      in_stack_fffffffffffffd80 = (ostream *)std::ostream::operator<<(poVar13,(int)local_a8);
      poVar13 = std::operator<<(in_stack_fffffffffffffd80,", ");
      in_stack_fffffffffffffd70 = (ostream *)std::ostream::operator<<(poVar13,(int)local_b8);
      in_stack_fffffffffffffd68 = std::operator<<(in_stack_fffffffffffffd70," xSampling ");
      in_stack_fffffffffffffd60 =
           (Array2D<unsigned_int> *)
           std::ostream::operator<<(in_stack_fffffffffffffd68,local_a8._4_4_);
      in_stack_fffffffffffffd58 =
           (Array2D<float> *)std::operator<<((ostream *)in_stack_fffffffffffffd60,", ");
      in_stack_fffffffffffffd50 =
           (Array2D<Imath_3_2::half> *)
           std::ostream::operator<<(in_stack_fffffffffffffd58,local_b8._4_4_);
      in_stack_fffffffffffffd48 =
           std::operator<<((ostream *)in_stack_fffffffffffffd50," ySampling ");
      poVar13 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd48,(int)uStack_a0);
      poVar13 = std::operator<<(poVar13,", ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)uStack_b0);
      poVar13 = std::operator<<(poVar13," pLinear ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(bool)(uStack_a0._4_1_ & 1));
      poVar13 = std::operator<<(poVar13,", ");
      this_00 = (void *)std::ostream::operator<<(poVar13,(bool)(uStack_b0._4_1_ & 1));
      std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    }
    this_01 = (ChannelList *)Imf_3_2::Header::channels();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    pCVar14 = (ChannelList *)Imf_3_2::Header::channels();
    bVar4 = Imf_3_2::ChannelList::operator==(this_01,pCVar14);
    if ((bVar4 & 1) == 0) {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_2::Header::name_abi_cxx11_();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    Imf_3_2::Header::name_abi_cxx11_();
    _Var5 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    if (!_Var5) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_2::Header::type_abi_cxx11_();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,local_78);
    Imf_3_2::Header::type_abi_cxx11_();
    _Var5 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    if (!_Var5) {
      __assert_fail("header.type () == headers[i].type ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x2b2,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    local_78 = local_78 + 1;
  }
  __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
}

Assistant:

void
readWholeFiles (const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file (fn.c_str ());
    for (int i = 0; i < file.parts (); i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());
        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        assert (header.type () == headers[i].type ());
    }

    cout << "Reading whole files " << flush;

    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    int         nHeaders = static_cast<int> (headers.size ());
    for (int i = 0; i < nHeaders; i++)
        shuffledPartNumber.push_back (i);
    for (int i = 0; i < nHeaders; i++)
    {
        int a = random_int (nHeaders);
        int b = random_int (nHeaders);
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }

    //
    // Start reading whole files.
    //
    int i;
    int partNumber;
    try
    {
        for (i = 0; i < nHeaders; i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0: {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        uData,
                        fData,
                        hData,
                        width,
                        height);

                    InputPart part (file, partNumber);
                    part.setFrameBuffer (frameBuffer);
                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                uData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (fData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (hData, width, height));
                            break;
                    }
                    break;
                }
                case 1: {
                    TiledInputPart part (file, partNumber);
                    int            numXLevels = part.numXLevels ();
                    int            numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                uData,
                                fData,
                                hData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);
                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);
                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        uData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (fData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2: {
                    DeepScanLineInputPart part (file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase (height, width);
                    frameBuffer.insertSampleCountSlice (Slice (
                        IMF::UINT,
                        (char*) (&sampleCount[0][0]),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.setFrameBuffer (frameBuffer);

                    part.readPixelSampleCounts (0, height - 1);

                    allocatePixels (
                        pixelTypes[partNumber],
                        sampleCount,
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (
                                sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (
                                sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels (
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    break;
                }
                case 3: {
                    DeepTiledInputPart part (file, partNumber);
                    int                numXLevels = part.numXLevels ();
                    int                numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase (h, w);
                            frameBuffer.insertSampleCountSlice (Slice (
                                IMF::UINT,
                                (char*) (&sampleCount[0][0]),
                                sizeof (unsigned int) * 1,
                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);

                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);

                            part.readPixelSampleCounts (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);

                            allocatePixels (
                                pixelTypes[partNumber],
                                sampleCount,
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (
                                        sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (
                                        sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels (
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);
                        }

                    break;
                }
            }
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}